

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderLoader.cpp
# Opt level: O2

void __thiscall
Assimp::BlenderImporter::ConvertBlendFile
          (BlenderImporter *this,aiScene *out,Scene *in,FileDatabase *file)

{
  Object *pOVar1;
  aiScene *paVar2;
  aiNode *this_00;
  size_type sVar3;
  aiNode **__s;
  reference ppOVar4;
  aiNode *paVar5;
  aiMesh **__dest;
  aiLight **__dest_00;
  aiCamera **__dest_01;
  aiMaterial **__dest_02;
  aiTexture **__dest_03;
  uint i;
  ulong uVar6;
  long lVar7;
  shared_ptr<Assimp::Blender::Base> cur;
  deque<const_Assimp::Blender::Object_*,_std::allocator<const_Assimp::Blender::Object_*>_>
  no_parents;
  ConversionData conv;
  Object *local_228;
  BlenderImporter *local_220;
  undefined1 local_218 [12];
  undefined8 uStack_20c;
  undefined4 local_204;
  undefined8 local_200;
  undefined8 uStack_1f8;
  float local_1f0;
  undefined8 local_1ec;
  undefined8 uStack_1e4;
  float local_1dc;
  aiScene *local_1d8;
  _Deque_base<const_Assimp::Blender::Object_*,_std::allocator<const_Assimp::Blender::Object_*>_>
  local_1d0;
  ConversionData local_180;
  
  local_220 = this;
  Blender::ConversionData::ConversionData(&local_180,file);
  std::
  _Deque_base<const_Assimp::Blender::Object_*,_std::allocator<const_Assimp::Blender::Object_*>_>::
  _Deque_base(&local_1d0);
  std::static_pointer_cast<Assimp::Blender::Base,Assimp::Blender::ElemBase>
            ((shared_ptr<Assimp::Blender::ElemBase> *)local_218);
  while (CONCAT44(local_218._4_4_,local_218._0_4_) != 0) {
    pOVar1 = *(Object **)(CONCAT44(local_218._4_4_,local_218._0_4_) + 0x28);
    if (pOVar1 != (Object *)0x0) {
      local_228 = pOVar1;
      if (pOVar1->parent == (Object *)0x0) {
        std::deque<Assimp::Blender::Object_const*,std::allocator<Assimp::Blender::Object_const*>>::
        emplace_back<Assimp::Blender::Object_const*>
                  ((deque<Assimp::Blender::Object_const*,std::allocator<Assimp::Blender::Object_const*>>
                    *)&local_1d0,&local_228);
      }
      else {
        std::
        _Rb_tree<Assimp::Blender::Object_const*,Assimp::Blender::Object_const*,std::_Identity<Assimp::Blender::Object_const*>,Assimp::Blender::ObjectCompare,std::allocator<Assimp::Blender::Object_const*>>
        ::_M_insert_unique<Assimp::Blender::Object_const*>
                  ((_Rb_tree<Assimp::Blender::Object_const*,Assimp::Blender::Object_const*,std::_Identity<Assimp::Blender::Object_const*>,Assimp::Blender::ObjectCompare,std::allocator<Assimp::Blender::Object_const*>>
                    *)&local_180,&local_228);
      }
    }
    std::__shared_ptr<Assimp::Blender::Base,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<Assimp::Blender::Base,_(__gnu_cxx::_Lock_policy)2> *)local_218,
               (__shared_ptr<Assimp::Blender::Base,_(__gnu_cxx::_Lock_policy)2> *)
               (CONCAT44(local_218._4_4_,local_218._0_4_) + 0x18));
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_218 + 8));
  std::__shared_ptr<Assimp::Blender::Base,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<Assimp::Blender::Base,_(__gnu_cxx::_Lock_policy)2> *)local_218,
             &(in->basact).super___shared_ptr<Assimp::Blender::Base,_(__gnu_cxx::_Lock_policy)2>);
  while (lVar7 = CONCAT44(local_218._4_4_,local_218._0_4_), lVar7 != 0) {
    pOVar1 = *(Object **)(lVar7 + 0x28);
    if ((pOVar1 != (Object *)0x0) && (pOVar1->parent != (Object *)0x0)) {
      local_228 = pOVar1;
      std::
      _Rb_tree<Assimp::Blender::Object_const*,Assimp::Blender::Object_const*,std::_Identity<Assimp::Blender::Object_const*>,Assimp::Blender::ObjectCompare,std::allocator<Assimp::Blender::Object_const*>>
      ::_M_insert_unique<Assimp::Blender::Object_const*>
                ((_Rb_tree<Assimp::Blender::Object_const*,Assimp::Blender::Object_const*,std::_Identity<Assimp::Blender::Object_const*>,Assimp::Blender::ObjectCompare,std::allocator<Assimp::Blender::Object_const*>>
                  *)&local_180,&local_228);
      lVar7 = CONCAT44(local_218._4_4_,local_218._0_4_);
    }
    std::__shared_ptr<Assimp::Blender::Base,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<Assimp::Blender::Base,_(__gnu_cxx::_Lock_policy)2> *)local_218,
               (__shared_ptr<Assimp::Blender::Base,_(__gnu_cxx::_Lock_policy)2> *)(lVar7 + 0x18));
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_218 + 8));
  if (local_1d0._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      local_1d0._M_impl.super__Deque_impl_data._M_start._M_cur) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_218,"Expected at least one object with no parent",
               (allocator<char> *)&local_228);
    LogFunctions<Assimp::BlenderImporter>::ThrowException((string *)local_218);
    std::__cxx11::string::~string((string *)local_218);
  }
  this_00 = (aiNode *)operator_new(0x478);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_218,"<BlenderRoot>",(allocator<char> *)&local_228);
  aiNode::aiNode(this_00,(string *)local_218);
  out->mRootNode = this_00;
  std::__cxx11::string::~string((string *)local_218);
  sVar3 = std::
          deque<const_Assimp::Blender::Object_*,_std::allocator<const_Assimp::Blender::Object_*>_>::
          size((deque<const_Assimp::Blender::Object_*,_std::allocator<const_Assimp::Blender::Object_*>_>
                *)&local_1d0);
  this_00->mNumChildren = (uint)sVar3;
  uVar6 = (sVar3 & 0xffffffff) << 3;
  __s = (aiNode **)operator_new__(uVar6);
  local_1d8 = out;
  memset(__s,0,uVar6);
  this_00->mChildren = __s;
  for (uVar6 = 0; uVar6 < (sVar3 & 0xffffffff); uVar6 = uVar6 + 1) {
    ppOVar4 = std::
              _Deque_iterator<const_Assimp::Blender::Object_*,_const_Assimp::Blender::Object_*&,_const_Assimp::Blender::Object_**>
              ::operator[](&local_1d0._M_impl.super__Deque_impl_data._M_start,uVar6);
    local_218._0_4_ = 1.0;
    local_218._4_4_ = 0.0;
    local_218._8_4_ = 0.0;
    uStack_20c._0_4_ = 0.0;
    uStack_20c._4_4_ = 0.0;
    local_204 = 0x3f800000;
    local_200 = 0;
    uStack_1f8._0_4_ = 0.0;
    uStack_1f8._4_4_ = 0.0;
    local_1f0 = 1.0;
    local_1ec._0_4_ = 0.0;
    local_1ec._4_4_ = 0.0;
    uStack_1e4._0_4_ = 0.0;
    uStack_1e4._4_4_ = 0.0;
    local_1dc = 1.0;
    paVar5 = ConvertNode(local_220,in,*ppOVar4,&local_180,(aiMatrix4x4 *)local_218);
    this_00->mChildren[uVar6] = paVar5;
    this_00->mChildren[uVar6]->mParent = this_00;
    sVar3 = (size_type)this_00->mNumChildren;
  }
  BuildMaterials(local_220,&local_180);
  paVar2 = local_1d8;
  uVar6 = (long)local_180.meshes.arr.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl
                .super__Vector_impl_data._M_finish -
          (long)local_180.meshes.arr.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl
                .super__Vector_impl_data._M_start;
  if (uVar6 != 0) {
    local_1d8->mNumMeshes = (uint)(uVar6 >> 3);
    __dest = (aiMesh **)operator_new__(uVar6 & 0x7fffffff8);
    paVar2->mMeshes = __dest;
    memmove(__dest,local_180.meshes.arr.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                   _M_impl.super__Vector_impl_data._M_start,uVar6);
    local_180.meshes.arr.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_180.meshes.arr.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  uVar6 = (long)local_180.lights.arr.super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)local_180.lights.arr.super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
  if (uVar6 != 0) {
    paVar2->mNumLights = (uint)(uVar6 >> 3);
    __dest_00 = (aiLight **)operator_new__(uVar6 & 0x7fffffff8);
    paVar2->mLights = __dest_00;
    memmove(__dest_00,
            local_180.lights.arr.super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
            super__Vector_impl_data._M_start,uVar6);
    local_180.lights.arr.super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_180.lights.arr.super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  uVar6 = (long)local_180.cameras.arr.super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)local_180.cameras.arr.super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
  if (uVar6 != 0) {
    paVar2->mNumCameras = (uint)(uVar6 >> 3);
    __dest_01 = (aiCamera **)operator_new__(uVar6 & 0x7fffffff8);
    paVar2->mCameras = __dest_01;
    memmove(__dest_01,
            local_180.cameras.arr.super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>.
            _M_impl.super__Vector_impl_data._M_start,uVar6);
    local_180.cameras.arr.super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_180.cameras.arr.super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  uVar6 = (long)local_180.materials.arr.
                super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_180.materials.arr.
                super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (uVar6 != 0) {
    paVar2->mNumMaterials = (uint)(uVar6 >> 3);
    __dest_02 = (aiMaterial **)operator_new__(uVar6 & 0x7fffffff8);
    paVar2->mMaterials = __dest_02;
    memmove(__dest_02,
            local_180.materials.arr.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
            _M_impl.super__Vector_impl_data._M_start,uVar6);
    local_180.materials.arr.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_180.materials.arr.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
         _M_impl.super__Vector_impl_data._M_start;
  }
  uVar6 = (long)local_180.textures.arr.super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_180.textures.arr.super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
  if (uVar6 != 0) {
    paVar2->mNumTextures = (uint)(uVar6 >> 3);
    __dest_03 = (aiTexture **)operator_new__(uVar6 & 0x7fffffff8);
    paVar2->mTextures = __dest_03;
    memmove(__dest_03,
            local_180.textures.arr.super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>.
            _M_impl.super__Vector_impl_data._M_start,uVar6);
    local_180.textures.arr.super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_180.textures.arr.super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>.
         _M_impl.super__Vector_impl_data._M_start;
  }
  if (paVar2->mNumMeshes == 0) {
    *(byte *)&paVar2->mFlags = (byte)paVar2->mFlags | 1;
  }
  std::
  _Deque_base<const_Assimp::Blender::Object_*,_std::allocator<const_Assimp::Blender::Object_*>_>::
  ~_Deque_base(&local_1d0);
  Blender::ConversionData::~ConversionData(&local_180);
  return;
}

Assistant:

void BlenderImporter::ConvertBlendFile(aiScene* out, const Scene& in,const FileDatabase& file)
{
    ConversionData conv(file);

    // FIXME it must be possible to take the hierarchy directly from
    // the file. This is terrible. Here, we're first looking for
    // all objects which don't have parent objects at all -
    std::deque<const Object*> no_parents;
    for (std::shared_ptr<Base> cur = std::static_pointer_cast<Base> ( in.base.first ); cur; cur = cur->next) {
        if (cur->object) {
            if(!cur->object->parent) {
                no_parents.push_back(cur->object.get());
            } else {
                conv.objects.insert( cur->object.get() );
            }
        }
    }
    for (std::shared_ptr<Base> cur = in.basact; cur; cur = cur->next) {
        if (cur->object) {
            if(cur->object->parent) {
                conv.objects.insert(cur->object.get());
            }
        }
    }

    if (no_parents.empty()) {
        ThrowException("Expected at least one object with no parent");
    }

    aiNode* root = out->mRootNode = new aiNode("<BlenderRoot>");

    root->mNumChildren = static_cast<unsigned int>(no_parents.size());
    root->mChildren = new aiNode*[root->mNumChildren]();
    for (unsigned int i = 0; i < root->mNumChildren; ++i) {
        root->mChildren[i] = ConvertNode(in, no_parents[i], conv, aiMatrix4x4());
        root->mChildren[i]->mParent = root;
    }

    BuildMaterials(conv);

    if (conv.meshes->size()) {
        out->mMeshes = new aiMesh*[out->mNumMeshes = static_cast<unsigned int>( conv.meshes->size() )];
        std::copy(conv.meshes->begin(),conv.meshes->end(),out->mMeshes);
        conv.meshes.dismiss();
    }

    if (conv.lights->size()) {
        out->mLights = new aiLight*[out->mNumLights = static_cast<unsigned int>( conv.lights->size() )];
        std::copy(conv.lights->begin(),conv.lights->end(),out->mLights);
        conv.lights.dismiss();
    }

    if (conv.cameras->size()) {
        out->mCameras = new aiCamera*[out->mNumCameras = static_cast<unsigned int>( conv.cameras->size() )];
        std::copy(conv.cameras->begin(),conv.cameras->end(),out->mCameras);
        conv.cameras.dismiss();
    }

    if (conv.materials->size()) {
        out->mMaterials = new aiMaterial*[out->mNumMaterials = static_cast<unsigned int>( conv.materials->size() )];
        std::copy(conv.materials->begin(),conv.materials->end(),out->mMaterials);
        conv.materials.dismiss();
    }

    if (conv.textures->size()) {
        out->mTextures = new aiTexture*[out->mNumTextures = static_cast<unsigned int>( conv.textures->size() )];
        std::copy(conv.textures->begin(),conv.textures->end(),out->mTextures);
        conv.textures.dismiss();
    }

    // acknowledge that the scene might come out incomplete
    // by Assimp's definition of `complete`: blender scenes
    // can consist of thousands of cameras or lights with
    // not a single mesh between them.
    if (!out->mNumMeshes) {
        out->mFlags |= AI_SCENE_FLAGS_INCOMPLETE;
    }
}